

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

int __thiscall cs_impl::any::holder<tm>::kill(holder<tm> *this,__pid_t __pid,int __sig)

{
  cs::allocator_type<cs_impl::any::holder<tm>,_64UL,_cs_impl::default_allocator_provider>::free
            ((allocator_type<cs_impl::any::holder<tm>,_64UL,_cs_impl::default_allocator_provider> *)
             allocator,this);
  return (int)this;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}